

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrRequestWorldMeshAsyncML
                   (XrWorldMeshDetectorML detector,XrWorldMeshGetInfoML *getInfo,
                   XrWorldMeshBufferML *buffer,XrFutureEXT *future)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrWorldMeshDetectorML_T *in_stack_fffffffffffffd48;
  string local_2b0;
  string local_290;
  XrWorldMeshDetectorML detector_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_250;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba20590;
  detector_local = detector;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrWorldMeshDetectorML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&detector_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrWorldMeshDetectorMLHandle(&detector_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrWorldMeshDetectorML_T_*>::getWithInstanceInfo
                      (&g_worldmeshdetectorml_info,detector_local);
    instance_info = pVar3.second;
    if (getInfo == (XrWorldMeshGetInfoML *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrRequestWorldMeshAsyncML-getInfo-parameter",
                 (allocator *)&local_250);
      std::__cxx11::string::string
                ((string *)&local_2b0,"xrRequestWorldMeshAsyncML",
                 (allocator *)&stack0xfffffffffffffd4f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_290,
                 "Invalid NULL for XrWorldMeshGetInfoML \"getInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd4e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d0,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      this = &local_1d0;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrRequestWorldMeshAsyncML",(allocator *)&local_2b0);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,getInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrRequestWorldMeshAsyncML-getInfo-parameter",
                   (allocator *)&local_250);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrRequestWorldMeshAsyncML",
                   (allocator *)&stack0xfffffffffffffd4f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_290,"Command xrRequestWorldMeshAsyncML param getInfo is invalid"
                   ,(allocator *)&stack0xfffffffffffffd4e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e8,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1e8);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&oss);
        goto LAB_0021ab85;
      }
      if (buffer == (XrWorldMeshBufferML *)0x0) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrRequestWorldMeshAsyncML-buffer-parameter",
                   (allocator *)&local_250);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrRequestWorldMeshAsyncML",
                   (allocator *)&stack0xfffffffffffffd4f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_200,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_290,
                   "Invalid NULL for XrWorldMeshBufferML \"buffer\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd4e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_200,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        this = &local_200;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"xrRequestWorldMeshAsyncML",(allocator *)&local_2b0);
        XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,buffer);
        std::__cxx11::string::~string((string *)&oss);
        if (XVar2 == XR_SUCCESS) {
          XVar2 = XR_SUCCESS;
          if (future != (XrFutureEXT *)0x0) goto LAB_0021ab85;
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrRequestWorldMeshAsyncML-future-parameter",
                     (allocator *)&local_250);
          std::__cxx11::string::string
                    ((string *)&local_2b0,"xrRequestWorldMeshAsyncML",
                     (allocator *)&stack0xfffffffffffffd4f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_230,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_290,
                     "Invalid NULL for XrFutureEXT \"future\" which is not optional and must be non-NULL"
                     ,(allocator *)&stack0xfffffffffffffd4e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_2b0,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_230,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          this = &local_230;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrRequestWorldMeshAsyncML-buffer-parameter",
                     (allocator *)&local_250);
          std::__cxx11::string::string
                    ((string *)&local_2b0,"xrRequestWorldMeshAsyncML",
                     (allocator *)&stack0xfffffffffffffd4f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_218,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_290,
                     "Command xrRequestWorldMeshAsyncML param buffer is invalid",
                     (allocator *)&stack0xfffffffffffffd4e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_2b0,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_218,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          this = &local_218;
        }
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrWorldMeshDetectorML handle \"detector\" ");
    HandleToHexString<XrWorldMeshDetectorML_T*>(in_stack_fffffffffffffd48);
    std::operator<<((ostream *)&oss,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string
              ((string *)&local_2b0,"VUID-xrRequestWorldMeshAsyncML-detector-parameter",
               (allocator *)&stack0xfffffffffffffd4f);
    std::__cxx11::string::string
              ((string *)&local_290,"xrRequestWorldMeshAsyncML",
               (allocator *)&stack0xfffffffffffffd4e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2b0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b8,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_0021ab85:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrRequestWorldMeshAsyncML(
XrWorldMeshDetectorML detector,
const XrWorldMeshGetInfoML* getInfo,
XrWorldMeshBufferML* buffer,
XrFutureEXT* future) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(detector, XR_OBJECT_TYPE_WORLD_MESH_DETECTOR_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrWorldMeshDetectorMLHandle(&detector);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrWorldMeshDetectorML handle \"detector\" ";
                oss << HandleToHexString(detector);
                CoreValidLogMessage(nullptr, "VUID-xrRequestWorldMeshAsyncML-detector-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_worldmeshdetectorml_info.getWithInstanceInfo(detector);
        GenValidUsageXrHandleInfo *gen_worldmeshdetectorml_info = info_with_instance.first;
        (void)gen_worldmeshdetectorml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrRequestWorldMeshAsyncML-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML", objects_info,
                                "Invalid NULL for XrWorldMeshGetInfoML \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrWorldMeshGetInfoML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrRequestWorldMeshAsyncML", objects_info,
                                                        true, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrRequestWorldMeshAsyncML-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML",
                                objects_info,
                                "Command xrRequestWorldMeshAsyncML param getInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == buffer) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrRequestWorldMeshAsyncML-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML", objects_info,
                                "Invalid NULL for XrWorldMeshBufferML \"buffer\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrWorldMeshBufferML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrRequestWorldMeshAsyncML", objects_info,
                                                        false, true, buffer);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrRequestWorldMeshAsyncML-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML",
                                objects_info,
                                "Command xrRequestWorldMeshAsyncML param buffer is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == future) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrRequestWorldMeshAsyncML-future-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrRequestWorldMeshAsyncML", objects_info,
                                "Invalid NULL for XrFutureEXT \"future\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrRequestWorldMeshAsyncML-future-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}